

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeForwardPointerDebugType(Builder *this,StorageClass storageClass)

{
  Id IVar1;
  Id typeId;
  Instruction *pIVar2;
  mapped_type *this_00;
  value_type local_30;
  key_type local_24;
  Instruction *local_20;
  Instruction *type;
  Id scID;
  StorageClass storageClass_local;
  Builder *this_local;
  
  type._4_4_ = storageClass;
  _scID = this;
  type._0_4_ = makeUintConstant(this,storageClass,false);
  addExtension(this,"SPV_KHR_relaxed_extended_instruction");
  pIVar2 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  typeId = makeVoidType(this);
  spv::Instruction::Instruction(pIVar2,IVar1,typeId,OpExtInstWithForwardRefsKHR);
  local_20 = pIVar2;
  spv::Instruction::addIdOperand(pIVar2,this->nonSemanticShaderDebugInfo);
  spv::Instruction::addImmediateOperand(local_20,3);
  pIVar2 = local_20;
  IVar1 = spv::Instruction::getResultId(local_20);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  spv::Instruction::addIdOperand(local_20,(Id)type);
  pIVar2 = local_20;
  IVar1 = makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  local_24 = 3;
  this_00 = std::
            unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
            ::operator[](&this->groupedDebugTypes,&local_24);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(this_00,&local_20)
  ;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
             local_20);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,&local_30);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_30);
  Module::mapInstruction(&this->module,local_20);
  IVar1 = spv::Instruction::getResultId(local_20);
  return IVar1;
}

Assistant:

Id Builder::makeForwardPointerDebugType(StorageClass storageClass)
{
    const Id scID = makeUintConstant(storageClass);

    this->addExtension(spv::E_SPV_KHR_relaxed_extended_instruction);

    Instruction *type = new Instruction(getUniqueId(), makeVoidType(), OpExtInstWithForwardRefsKHR);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(NonSemanticShaderDebugInfo100DebugTypePointer);
    type->addIdOperand(type->getResultId());
    type->addIdOperand(scID);
    type->addIdOperand(makeUintConstant(0));

    groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypePointer].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}